

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::switch_modes(Application *this,uint key)

{
  undefined4 in_ESI;
  Application *in_RDI;
  Application *unaff_retaddr;
  Application *in_stack_00000010;
  
  switch(in_ESI) {
  case 0x41:
  case 0x61:
    to_animate_mode(in_stack_00000010);
    setupElementTransformWidget(unaff_retaddr);
    break;
  default:
    break;
  case 0x4d:
  case 0x6d:
    to_model_mode(in_stack_00000010);
    setupElementTransformWidget(unaff_retaddr);
    break;
  case 0x52:
  case 0x72:
    to_render_mode(in_RDI);
    setupElementTransformWidget(unaff_retaddr);
    break;
  case 0x56:
  case 0x76:
    to_visualize_mode(in_RDI);
    setupElementTransformWidget(unaff_retaddr);
  }
  return;
}

Assistant:

void Application::switch_modes(unsigned int key) {
  switch (key) {
    case 'a':
    case 'A':
      to_animate_mode();
      setupElementTransformWidget();
      break;
    case 'm':
    case 'M':
      to_model_mode();
      setupElementTransformWidget();
      break;
    case 'r':
    case 'R':
      to_render_mode();
      setupElementTransformWidget();
      break;
    case 'v':
    case 'V':
      to_visualize_mode();
      setupElementTransformWidget();
      break;
    default:
      break;
  }
}